

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O1

void __thiscall QSyntaxHighlighterPrivate::applyFormatChanges(QSyntaxHighlighterPrivate *this)

{
  QTextBlock *this_00;
  FormatRange *pFVar1;
  Data *pDVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QTextLayout *this_01;
  iterator aend;
  iterator iVar8;
  QObject *this_02;
  FormatRange *pFVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  const_iterator abegin;
  FormatRange *pFVar14;
  long lVar15;
  long in_FS_OFFSET;
  int local_98;
  QArrayDataPointer<QTextLayout::FormatRange> local_78;
  undefined8 local_58;
  undefined1 auStack_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->currentBlock;
  this_01 = QTextBlock::layout(this_00);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::formats((QList<QTextLayout::FormatRange> *)&local_78,this_01);
  iVar6 = QTextLayout::preeditAreaPosition(this_01);
  QTextLayout::preeditAreaText((QString *)&local_58,this_01);
  uVar3 = auStack_50._8_8_;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  local_98 = (int)uVar3;
  if (local_98 == 0) {
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      QList<QTextLayout::FormatRange>::clear((QList<QTextLayout::FormatRange> *)&local_78);
      bVar5 = true;
      goto LAB_004c119b;
    }
  }
  else {
    lVar11 = local_78.size >> 2;
    pFVar14 = local_78.ptr;
    if (0 < lVar11) {
      iVar12 = iVar6 + local_98;
      pFVar14 = local_78.ptr + lVar11 * 4;
      lVar11 = lVar11 + 1;
      pFVar9 = local_78.ptr + 2;
      do {
        if ((pFVar9[-2].start < iVar6) || (iVar12 < pFVar9[-2].start + pFVar9[-2].length)) {
          pFVar9 = pFVar9 + -2;
          goto LAB_004c10f8;
        }
        if ((pFVar9[-1].start < iVar6) || (iVar12 < pFVar9[-1].start + pFVar9[-1].length)) {
          pFVar9 = pFVar9 + -1;
          goto LAB_004c10f8;
        }
        if ((pFVar9->start < iVar6) || (iVar12 < pFVar9->start + pFVar9->length)) goto LAB_004c10f8;
        if ((pFVar9[1].start < iVar6) || (iVar12 < pFVar9[1].start + pFVar9[1].length)) {
          pFVar9 = pFVar9 + 1;
          goto LAB_004c10f8;
        }
        lVar11 = lVar11 + -1;
        pFVar9 = pFVar9 + 4;
      } while (1 < lVar11);
    }
    pFVar1 = local_78.ptr + local_78.size;
    lVar11 = ((long)pFVar1 - (long)pFVar14 >> 3) * -0x5555555555555555;
    if (lVar11 == 1) {
LAB_004c10af:
      pFVar9 = pFVar14;
      if ((iVar6 <= pFVar14->start) &&
         (pFVar9 = pFVar1, local_98 + iVar6 < pFVar14->start + pFVar14->length)) {
        pFVar9 = pFVar14;
      }
    }
    else if (lVar11 == 2) {
LAB_004c1095:
      pFVar9 = pFVar14;
      if ((iVar6 <= pFVar14->start) && (pFVar14->start + pFVar14->length <= local_98 + iVar6)) {
        pFVar14 = pFVar14 + 1;
        goto LAB_004c10af;
      }
    }
    else {
      pFVar9 = pFVar1;
      if (((lVar11 == 3) && (pFVar9 = pFVar14, iVar6 <= pFVar14->start)) &&
         (pFVar14->start + pFVar14->length <= local_98 + iVar6)) {
        pFVar14 = pFVar14 + 1;
        goto LAB_004c1095;
      }
    }
LAB_004c10f8:
    lVar11 = (long)pFVar9 - (long)local_78.ptr;
    if ((lVar11 >> 3) * -0x5555555555555555 - local_78.size != 0) {
      aend = QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_78);
      iVar8 = QList<QTextLayout::FormatRange>::begin((QList<QTextLayout::FormatRange> *)&local_78);
      abegin.i = iVar8.i + lVar11;
      pFVar14 = iVar8.i + lVar11 + 0x18;
      if (pFVar14 != aend.i) {
        do {
          if ((iVar6 <= pFVar14->start) && (pFVar14->start + pFVar14->length <= local_98 + iVar6)) {
            iVar12 = pFVar14->length;
            (abegin.i)->start = pFVar14->start;
            (abegin.i)->length = iVar12;
            QTextFormat::operator=
                      (&((abegin.i)->format).super_QTextFormat,&(pFVar14->format).super_QTextFormat)
            ;
            abegin.i = abegin.i + 1;
          }
          pFVar14 = pFVar14 + 1;
        } while (pFVar14 != aend.i);
      }
      QList<QTextLayout::FormatRange>::erase
                ((QList<QTextLayout::FormatRange> *)&local_78,abegin,(const_iterator)aend.i);
      bVar5 = aend.i != abegin.i && -1 < (long)aend.i - (long)abegin.i;
      goto LAB_004c119b;
    }
  }
  bVar5 = false;
LAB_004c119b:
  iVar12 = 0;
  do {
    lVar11 = (long)iVar12;
    if ((this->formatChanges).d.size <= lVar11) break;
    auStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    auStack_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)auStack_50);
    if (lVar11 < (this->formatChanges).d.size) {
      lVar13 = lVar11 << 4;
      do {
        bVar4 = QTextFormat::operator==
                          ((QTextFormat *)
                           ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr +
                           lVar13),(QTextFormat *)auStack_50);
        if (!bVar4) break;
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + 0x10;
      } while (lVar11 < (this->formatChanges).d.size);
      iVar12 = (int)lVar11;
    }
    lVar13 = (this->formatChanges).d.size;
    if (lVar13 != lVar11) {
      local_58 = (QArrayData *)CONCAT44(local_58._4_4_,iVar12);
      QTextFormat::operator=
                ((QTextFormat *)auStack_50,&(this->formatChanges).d.ptr[lVar11].super_QTextFormat);
      lVar15 = (long)iVar12;
      if (lVar15 < (this->formatChanges).d.size) {
        lVar10 = lVar15 << 4;
        do {
          bVar5 = QTextFormat::operator==
                            ((QTextFormat *)
                             ((long)&(((this->formatChanges).d.ptr)->super_QTextFormat).d.d.ptr +
                             lVar10),(QTextFormat *)auStack_50);
          if (!bVar5) break;
          lVar15 = lVar15 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar15 < (this->formatChanges).d.size);
        iVar12 = (int)lVar15;
      }
      iVar7 = iVar12 - (int)local_58;
      local_58 = (QArrayData *)CONCAT44(iVar7,(int)local_58);
      if (local_98 != 0) {
        if ((int)local_58 < iVar6) {
          if (iVar6 <= iVar12) {
            local_58 = (QArrayData *)CONCAT44(iVar7 + local_98,(int)local_58);
          }
        }
        else {
          local_58 = (QArrayData *)CONCAT44(iVar7,(int)local_58 + local_98);
        }
      }
      QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
      emplace<QTextLayout::FormatRange_const&>
                ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_78,local_78.size,
                 (FormatRange *)&local_58);
      QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_78);
      bVar5 = true;
    }
    QTextFormat::~QTextFormat((QTextFormat *)auStack_50);
  } while (lVar13 != lVar11);
  if (bVar5) {
    QTextLayout::setFormats(this_01,(QList<QTextLayout::FormatRange> *)&local_78);
    pDVar2 = (this->doc).wp.d;
    if (pDVar2 == (Data *)0x0) {
      this_02 = (QObject *)0x0;
    }
    else if ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      this_02 = (QObject *)0x0;
    }
    else {
      this_02 = (this->doc).wp.value;
    }
    iVar6 = QTextBlock::position(this_00);
    iVar12 = QTextBlock::length(this_00);
    QTextDocument::markContentsDirty((QTextDocument *)this_02,iVar6,iVar12);
  }
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighterPrivate::applyFormatChanges()
{
    bool formatsChanged = false;

    QTextLayout *layout = currentBlock.layout();

    QList<QTextLayout::FormatRange> ranges = layout->formats();

    const int preeditAreaStart = layout->preeditAreaPosition();
    const int preeditAreaLength = layout->preeditAreaText().size();

    if (preeditAreaLength != 0) {
        auto isOutsidePreeditArea = [=](const QTextLayout::FormatRange &range) {
            return range.start < preeditAreaStart
                    || range.start + range.length > preeditAreaStart + preeditAreaLength;
        };
        if (ranges.removeIf(isOutsidePreeditArea) > 0)
            formatsChanged = true;
    } else if (!ranges.isEmpty()) {
        ranges.clear();
        formatsChanged = true;
    }

    int i = 0;
    while (i < formatChanges.size()) {
        QTextLayout::FormatRange r;

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        if (i == formatChanges.size())
            break;

        r.start = i;
        r.format = formatChanges.at(i);

        while (i < formatChanges.size() && formatChanges.at(i) == r.format)
            ++i;

        Q_ASSERT(i <= formatChanges.size());
        r.length = i - r.start;

        if (preeditAreaLength != 0) {
            if (r.start >= preeditAreaStart)
                r.start += preeditAreaLength;
            else if (r.start + r.length >= preeditAreaStart)
                r.length += preeditAreaLength;
        }

        ranges << r;
        formatsChanged = true;
    }

    if (formatsChanged) {
        layout->setFormats(ranges);
        doc->markContentsDirty(currentBlock.position(), currentBlock.length());
    }
}